

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.c
# Opt level: O1

void check_tutorial_farlook(int x,int y)

{
  monst *pmVar1;
  obj *poVar2;
  rm (*parVar3) [21];
  boolean bVar4;
  int iVar5;
  
  if (flags.tutorial == '\0') {
    return;
  }
  parVar3 = level->locations;
  if ((level->locations[x][y].field_0x6 & 8) == 0) {
    iVar5 = dbuf_get_mon(x,y);
    if (((iVar5 == 0) || (pmVar1 = level->monsters[x][y], pmVar1 == (monst *)0x0)) ||
       ((pmVar1->field_0x61 & 2) != 0)) {
      poVar2 = level->objects[x][y];
      if (poVar2 != (obj *)0x0) {
        check_tutorial_oclass((int)poVar2->oclass);
        return;
      }
      if ((undefined1  [12])((undefined1  [12])parVar3[x][y] & (undefined1  [12])0x7ff) ==
          (undefined1  [12])0x0) {
        return;
      }
      check_tutorial_location(x,y,'\x01');
      return;
    }
    if (((pmVar1->mtame == '\0') ||
        (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar4 = dmgtype(youmonst.data,0x24), bVar4 == '\0')))))) &&
       (((u.ux != x || (u.uy != y)) || (u.usteed == (monst *)0x0)))) {
      if (((pmVar1->field_0x62 & 0x40) == 0) ||
         (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
          ((u.umonnum == u.umonster || (bVar4 = dmgtype(youmonst.data,0x24), bVar4 == '\0')))))) {
        if ((u.ux == x) && (u.uy == y)) {
          return;
        }
        if (flags.tutorial == '\0') {
          return;
        }
        if ('\0' < pl_tutorial[10]) {
          return;
        }
        pl_tutorial[10] = '\x01';
        tutorial_latest_message = 0xd3;
        iVar5 = 0xd3;
      }
      else {
        if (flags.tutorial == '\0') {
          return;
        }
        if ('\0' < pl_tutorial[0xb]) {
          return;
        }
        pl_tutorial[0xb] = '\x01';
        tutorial_latest_message = 0xd4;
        iVar5 = 0xd4;
      }
    }
    else {
      if (flags.tutorial == '\0') {
        return;
      }
      if ('\0' < pl_tutorial[9]) {
        return;
      }
      pl_tutorial[9] = '\x01';
      tutorial_latest_message = 0xd2;
      iVar5 = 0xd2;
    }
  }
  else {
    if ('\0' < pl_tutorial[0xc]) {
      return;
    }
    pl_tutorial[0xc] = '\x01';
    tutorial_latest_message = 0xd5;
    iVar5 = 0xd5;
  }
  com_pager(iVar5);
  return;
}

Assistant:

void check_tutorial_farlook(int x, int y)
{
	const struct rm *l = &level->locations[x][y];
	int monid;
	const struct monst *mtmp;
	const struct obj *otmp;

	if (!flags.tutorial) return; /* short-circuit */

	/* Monsters */
	if (l->mem_invis) {
	    check_tutorial_message(QT_T_LOOK_INVISIBLE);
	    return;
	}

	monid = dbuf_get_mon(x, y) - 1;
	if (monid != -1 && (mtmp = m_at(level, x, y))) {
	    mtmp = m_at(level, x, y);
	    if (mtmp &&
		((mtmp->mtame && !Hallucination) ||
		 /* riding implies tameness */
		 (x == u.ux && y == u.uy && u.usteed))) {
		check_tutorial_message(QT_T_LOOK_TAME);
	    } else if (mtmp && mtmp->mpeaceful && !Hallucination) {
		check_tutorial_message(QT_T_LOOK_PEACEFUL);
	    } else if (x == u.ux && y == u.uy) {
		/* looking at yourself, no message yet */
	    } else {
		check_tutorial_message(QT_T_LOOK_HOSTILE);
	    }
	    return;
	}

	/* Items */
	otmp = vobj_at(x, y);
	if (otmp) {
	    check_tutorial_oclass(otmp->oclass);
	    return;
	}

	/* Terrain */
	if (l->mem_bg || l->mem_trap) {
	    check_tutorial_location(x, y, TRUE);
	    return;
	}
}